

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::init<Kernel::Literal*>
          (FastGeneralizationsIterator *this,
          SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *parent,Node *root,
          Literal *query,bool retrieveSubstitution,bool reversed)

{
  int *piVar1;
  int iVar2;
  IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *in_RAX;
  VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> local_38;
  
  this->_retrieveSubstitution = retrieveSubstitution;
  local_38._core = in_RAX;
  iVar2 = (*root->_vptr_Node[2])(root);
  this->_inLeaf = SUB41(iVar2,0);
  SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
  init<Kernel::Literal*>(&this->_subst,query,parent->_nextVar);
  if (this->_inLeaf == true) {
    (*root->_vptr_Node[8])(&local_38,root);
  }
  else {
    Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::getEmpty();
  }
  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Lhs_*>::operator=
            (&this->_ldIterator,&local_38);
  if (local_38._core != (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Lhs_*> *)0x0) {
    piVar1 = &(local_38._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_38._core)->_vptr_IteratorCore[1])();
    }
  }
  this->_root = root;
  createBindings<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::FastGeneralizationsIterator::init<Kernel::Literal*>(Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node*,Kernel::Literal*,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (parent,query,reversed,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _subst.init(query, parent->_nextVar);
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;

        _iterCntr = parent->_iterCnt;
        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });
      }